

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void do_test_tlsblock(size_t len_encoded,size_t max_bytes)

{
  ulong body_size_00;
  uint8_t *puVar1;
  size_t local_e8;
  size_t local_e0;
  size_t body_size_1;
  ulong local_c8;
  size_t i_2;
  size_t body_start_1;
  size_t capacity_1;
  size_t i_1;
  uint8_t *puStack_a0;
  int bytes_eq;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  size_t body_size;
  ulong local_68;
  size_t i;
  size_t body_start;
  size_t capacity;
  int ret;
  int expect_overflow;
  uint8_t *end;
  uint8_t *src;
  ptls_buffer_t buf;
  size_t max_bytes_local;
  size_t len_encoded_local;
  
  capacity._4_4_ = 0;
  buf._24_8_ = max_bytes;
  ptls_buffer_init((ptls_buffer_t *)&src,"",0);
  local_e0 = len_encoded;
  if (len_encoded == 0xffffffffffffffff) {
    local_e0 = 1;
  }
  body_start = len_encoded;
  capacity._0_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)&src,"",local_e0);
  if ((int)capacity == 0) {
    i = buf.capacity;
    for (local_68 = 0; capacity._0_4_ = 0, local_68 < (ulong)buf._24_8_; local_68 = local_68 + 1) {
      body_size._7_1_ = (undefined1)local_68;
      capacity._0_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)&src,(void *)((long)&body_size + 7),1)
      ;
      if ((int)capacity != 0) goto LAB_0014bdca;
    }
    _capacity = buf.capacity - i;
    if (body_start == 0xffffffffffffffff) {
      capacity._0_4_ = ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)&src,_capacity);
      if ((int)capacity != 0) goto LAB_0014bdca;
    }
    else {
      if ((body_start < 8) && ((ulong)(1L << ((byte)(body_start << 3) & 0x3f)) <= _capacity)) {
        capacity._0_4_ = 0x20c;
        goto LAB_0014bdca;
      }
      for (; body_start != 0; body_start = body_start - 1) {
        src[i - body_start] = (uint8_t)(_capacity >> (((char)body_start + -1) * '\b' & 0x3fU));
      }
    }
    capacity._0_4_ = 0;
    end = src;
    _ret = src + buf.capacity;
    _block_size = len_encoded;
    if (len_encoded == 0xffffffffffffffff) {
      end_1 = src;
      _src = (uint8_t *)ptls_decode_quicint(&end_1,_ret);
      if (_src == (uint8_t *)0xffffffffffffffff) {
        capacity._0_4_ = 0x32;
        goto LAB_0014bdca;
      }
      end = end_1;
      _block_size64 = (uint64_t)_src;
    }
    else {
      if ((ulong)((long)_ret - (long)src) < len_encoded) {
        capacity._0_4_ = 0x32;
        goto LAB_0014bdca;
      }
      _block_size64 = 0;
      do {
        puVar1 = end + 1;
        _block_size64 = _block_size64 << 8 | (ulong)*end;
        _block_size = _block_size - 1;
        end = puVar1;
      } while (_block_size != 0);
      _block_size = 0;
    }
    if ((ulong)((long)_ret - (long)end) < _block_size64) {
      capacity._0_4_ = 0x32;
    }
    else {
      puStack_a0 = end + _block_size64;
      _ok((uint)((long)puStack_a0 - (long)end == buf._24_8_),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x874);
      i_1._4_4_ = 1;
      for (capacity_1 = 0; capacity_1 < (ulong)buf._24_8_; capacity_1 = capacity_1 + 1) {
        if ((uint)end[capacity_1] != ((uint)capacity_1 & 0xff)) {
          i_1._4_4_ = 0;
        }
      }
      _ok(i_1._4_4_,"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x87a);
      end = puStack_a0;
      if (puStack_a0 == _ret) {
        local_e8 = len_encoded;
        if (len_encoded == 0xffffffffffffffff) {
          local_e8 = 1;
        }
        body_start_1 = len_encoded;
        capacity._0_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)&src,"",local_e8);
        if ((int)capacity == 0) {
          i_2 = buf.capacity;
          for (local_c8 = 0; local_c8 < buf._24_8_ + 1; local_c8 = local_c8 + 1) {
            body_size_1._7_1_ = 1;
            capacity._0_4_ =
                 ptls_buffer__do_pushv((ptls_buffer_t *)&src,(void *)((long)&body_size_1 + 7),1);
            if ((int)capacity != 0) goto LAB_0014bdca;
          }
          capacity._4_4_ = 1;
          body_size_00 = buf.capacity - i_2;
          if (body_start_1 == 0xffffffffffffffff) {
            capacity._0_4_ = ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)&src,body_size_00);
            if ((int)capacity != 0) goto LAB_0014bdca;
          }
          else {
            if ((body_start_1 < 8) &&
               ((ulong)(1L << ((byte)(body_start_1 << 3) & 0x3f)) <= body_size_00)) {
              capacity._0_4_ = 0x20c;
              goto LAB_0014bdca;
            }
            for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
              src[i_2 - body_start_1] =
                   (uint8_t)(body_size_00 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
            }
          }
          _ok(0,"%s %d",
              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x884);
        }
      }
      else {
        capacity._0_4_ = 0x32;
      }
    }
  }
LAB_0014bdca:
  if ((int)capacity != 0) {
    if (capacity._4_4_ == 0) {
      _ok(0,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",
          0x88b);
    }
    else {
      _ok((uint)((int)capacity == 0x20c),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/picotls.c",0x889);
    }
  }
  ptls_buffer_dispose((ptls_buffer_t *)&src);
  return;
}

Assistant:

static void do_test_tlsblock(size_t len_encoded, size_t max_bytes)
{
    ptls_buffer_t buf;
    const uint8_t *src, *end;
    int expect_overflow = 0, ret;

    /* block that fits in */
    ptls_buffer_init(&buf, "", 0);
    ptls_buffer_push_block(&buf, len_encoded, {
        for (size_t i = 0; i < max_bytes; ++i)
            ptls_buffer_push(&buf, (uint8_t)i);
    });
    src = buf.base;
    end = buf.base + buf.off;
    ptls_decode_block(src, end, len_encoded, {
        ok(end - src == max_bytes);
        int bytes_eq = 1;
        for (size_t i = 0; i < max_bytes; ++i) {
            if (src[i] != (uint8_t)i)
                bytes_eq = 0;
        }
        ok(bytes_eq);
        src = end;
    });

    /* block that does not fit in */
    ptls_buffer_push_block(&buf, len_encoded, {
        for (size_t i = 0; i < max_bytes + 1; i++)
            ptls_buffer_push(&buf, 1);
        expect_overflow = 1;
    });
    ok(!"fail");

Exit:
    if (ret != 0) {
        if (expect_overflow) {
            ok(ret == PTLS_ERROR_BLOCK_OVERFLOW);
        } else {
            ok(!"fail");
        }
    }
    ptls_buffer_dispose(&buf);
}